

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O0

void __thiscall
glu::Texture1D::Texture1D
          (Texture1D *this,RenderContext *context,deUint32 format,deUint32 dataType,int width)

{
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  Functions *gl;
  int local_24;
  deUint32 local_20;
  int width_local;
  deUint32 dataType_local;
  deUint32 format_local;
  RenderContext *context_local;
  Texture1D *this_local;
  
  this->m_context = context;
  this->m_format = format;
  local_24 = width;
  local_20 = dataType;
  width_local = format;
  _dataType_local = context;
  context_local = (RenderContext *)this;
  register0x00000000 = mapGLTransferFormat(format,dataType);
  tcu::Texture1D::Texture1D(&this->m_refTexture,(TextureFormat *)((long)&gl + 4),local_24);
  this->m_glTexture = 0;
  iVar1 = (*_dataType_local->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x6f8))(1,&this->m_glTexture);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  checkError(err,"glGenTextures() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
             ,0x3c);
  return;
}

Assistant:

Texture1D::Texture1D (const RenderContext& context, deUint32 format, deUint32 dataType, int width)
	: m_context			(context)
	, m_format			(format)
	, m_refTexture		(mapGLTransferFormat(format, dataType), width)
	, m_glTexture		(0)
{
	const glw::Functions& gl = context.getFunctions();
	gl.genTextures(1, &m_glTexture);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() failed");
}